

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

User * __thiscall
cmCTestP4::GetUserData(User *__return_storage_ptr__,cmCTestP4 *this,string *username)

{
  iterator iVar1;
  iterator iVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_users;
  OutputLogger err;
  UserParser out;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_198;
  LineParser local_180;
  UserParser local_140;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
          ::find(&(this->Users)._M_t,username);
  iVar2 = iVar1;
  if ((_Rb_tree_header *)iVar1._M_node == &(this->Users)._M_t._M_impl.super__Rb_tree_header) {
    local_198._M_impl.super__Vector_impl_data._M_start = (char **)0x0;
    local_198._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_198._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_198);
    local_140.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5253ee;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_198,(char **)&local_140);
    local_140.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5253f4;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_198,(char **)&local_140);
    local_140.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x56dcc8;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_198,(char **)&local_140);
    local_140.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(username->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_198,(char **)&local_140);
    local_140.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_198,(char **)&local_140);
    UserParser::UserParser(&local_140,this,"users-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)&local_180,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "users-err> ");
    cmCTestVC::RunChild((cmCTestVC *)this,local_198._M_impl.super__Vector_impl_data._M_start,
                        (OutputParser *)&local_140,&local_180.super_OutputParser,(char *)0x0);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
            ::find(&(this->Users)._M_t,username);
    if (iVar2._M_node == iVar1._M_node) {
      User::User(__return_storage_ptr__);
      cmProcessTools::LineParser::~LineParser(&local_180);
      UserParser::~UserParser(&local_140);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_198);
      return __return_storage_ptr__;
    }
    cmProcessTools::LineParser::~LineParser(&local_180);
    UserParser::~UserParser(&local_140);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_198);
  }
  User::User(__return_storage_ptr__,(User *)(iVar2._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

cmCTestP4::User cmCTestP4::GetUserData(const std::string& username)
{
  std::map<std::string, cmCTestP4::User>::const_iterator it =
          Users.find(username);

  if(it == Users.end())
    {
    std::vector<char const*> p4_users;
    SetP4Options(p4_users);
    p4_users.push_back("users");
    p4_users.push_back("-m");
    p4_users.push_back("1");
    p4_users.push_back(username.c_str());
    p4_users.push_back(0);

    UserParser out(this, "users-out> ");
    OutputLogger err(this->Log, "users-err> ");
    RunChild(&p4_users[0], &out, &err);

    // The user should now be added to the map. Search again.
    it = Users.find(username);
    if(it == Users.end())
      {
      return cmCTestP4::User();
      }
    }

  return it->second;
}